

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.hpp
# Opt level: O0

FilePath * de::FilePath::join(FilePath *__return_storage_ptr__,FilePath *a,FilePath *b)

{
  FilePath *pFVar1;
  FilePath local_40;
  FilePath *local_20;
  FilePath *b_local;
  FilePath *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  FilePath(&local_40,a);
  pFVar1 = join(&local_40,local_20);
  FilePath(__return_storage_ptr__,pFVar1);
  ~FilePath(&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline FilePath FilePath::join (const FilePath& a, const FilePath& b)
{
	return FilePath(a).join(b);
}